

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O2

double __thiscall despot::MDPUpperBound::Value(MDPUpperBound *this,Belief *belief)

{
  double dVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int i;
  ulong uVar5;
  double dVar6;
  
  iVar3 = (*belief->_vptr_Belief[6])(belief);
  dVar6 = 0.0;
  uVar5 = 0;
  while( true ) {
    lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
    if ((ulong)(((long *)CONCAT44(extraout_var,iVar3))[1] - lVar2 >> 3) <= uVar5) break;
    dVar1 = *(double *)(*(long *)(lVar2 + uVar5 * 8) + 0x18);
    iVar4 = (*this->indexer_->_vptr_StateIndexer[3])();
    dVar6 = dVar6 + dVar1 * (this->policy_).
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar4].value;
    uVar5 = uVar5 + 1;
  }
  return dVar6;
}

Assistant:

double MDPUpperBound::Value(const Belief* belief) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * policy_[indexer_.GetIndex(particle)].value;
	}
	return value;
}